

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3CreateColumnExpr(sqlite3 *db,SrcList *pSrc,int iSrc,int iCol)

{
  Table *pTVar1;
  Expr *pEVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Table *pTab;
  SrcItem *pItem;
  Expr *p;
  int local_3c;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar4;
  Token *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  
  pEVar2 = sqlite3ExprAlloc(in_stack_ffffffffffffffe0,
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                            in_stack_ffffffffffffffd0,
                            (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (pEVar2 != (Expr *)0x0) {
    lVar3 = in_RSI + 8 + (long)in_EDX * 0x48;
    pTVar1 = *(Table **)(lVar3 + 0x10);
    (pEVar2->y).pTab = pTVar1;
    pEVar2->iTable = *(int *)(lVar3 + 0x1c);
    if (((pEVar2->y).pTab)->iPKey == in_ECX) {
      pEVar2->iColumn = -1;
    }
    else {
      pEVar2->iColumn = (ynVar)in_ECX;
      if (((pTVar1->tabFlags & 0x60) == 0) || ((pTVar1->aCol[in_ECX].colFlags & 0x60) == 0)) {
        local_3c = in_ECX;
        if (0x3f < in_ECX) {
          local_3c = 0x3f;
        }
        *(ulong *)(lVar3 + 0x20) = 1L << ((byte)local_3c & 0x3f) | *(ulong *)(lVar3 + 0x20);
      }
      else {
        if (pTVar1->nCol < 0x40) {
          lVar4 = (1L << ((byte)pTVar1->nCol & 0x3f)) + -1;
        }
        else {
          lVar4 = -1;
        }
        *(long *)(lVar3 + 0x20) = lVar4;
      }
    }
  }
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3CreateColumnExpr(sqlite3 *db, SrcList *pSrc, int iSrc, int iCol){
  Expr *p = sqlite3ExprAlloc(db, TK_COLUMN, 0, 0);
  if( p ){
    SrcItem *pItem = &pSrc->a[iSrc];
    Table *pTab;
    assert( ExprUseYTab(p) );
    pTab = p->y.pTab = pItem->pSTab;
    p->iTable = pItem->iCursor;
    if( p->y.pTab->iPKey==iCol ){
      p->iColumn = -1;
    }else{
      p->iColumn = (ynVar)iCol;
      if( (pTab->tabFlags & TF_HasGenerated)!=0
       && (pTab->aCol[iCol].colFlags & COLFLAG_GENERATED)!=0
      ){
        testcase( pTab->nCol==63 );
        testcase( pTab->nCol==64 );
        pItem->colUsed = pTab->nCol>=64 ? ALLBITS : MASKBIT(pTab->nCol)-1;
      }else{
        testcase( iCol==BMS );
        testcase( iCol==BMS-1 );
        pItem->colUsed |= ((Bitmask)1)<<(iCol>=BMS ? BMS-1 : iCol);
      }
    }
  }
  return p;
}